

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void trial::protocol::serialization::
     load_overloader<trial::protocol::json::basic_iarchive<char>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_void>
     ::load(basic_iarchive<char> *archive,
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           *data,uint protocol_version)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  UI_STRING *uis;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool> *__x;
  view_type local_58;
  undefined1 local_48 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool> value;
  uint protocol_version_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *data_local;
  basic_iarchive<char> *archive_local;
  
  __x = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
         *)data;
  value._36_4_ = protocol_version;
  json::basic_iarchive<char>::load<trial::protocol::json::token::begin_object>(archive);
  while( true ) {
    bVar1 = json::basic_iarchive<char>::at<trial::protocol::json::token::end_object>(archive);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                *)local_48);
    iVar2 = json::basic_iarchive<char>::reader(archive,(UI *)__x,uis);
    local_58 = json::basic_reader<char>::literal((basic_reader<char> *)CONCAT44(extraout_var,iVar2))
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::size(&local_58);
    std::__cxx11::string::reserve((ulong)local_48);
    json::basic_iarchive<char>::load_override<std::__cxx11::string>
              (archive,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
               ,(ulong)(uint)value._36_4_);
    json::basic_iarchive<char>::load_override<bool>
              (archive,(bool *)(value.first.field_2._M_local_buf + 8),(ulong)(uint)value._36_4_);
    __x = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
           *)local_48;
    std::
    map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
    ::insert<std::pair<std::__cxx11::string,bool>&>
              ((map<std::__cxx11::string,bool,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                *)data,__x);
    std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
             *)local_48);
  }
  json::basic_iarchive<char>::load<trial::protocol::json::token::end_object>(archive);
  return;
}

Assistant:

static void load(json::basic_iarchive<CharT>& archive,
                     std::map<std::string, T, Compare, MapAllocator>& data,
                     const unsigned int protocol_version)
    {
        archive.template load<json::token::begin_object>();
        while (!archive.template at<json::token::end_object>())
        {
            // We cannot use std::map<Key, T>::value_type because it has a const key
            std::pair<std::string, T> value;
            value.first.reserve(archive.reader().literal().size());
            archive.load_override(value.first, protocol_version);
            archive.load_override(value.second, protocol_version);
            data.insert(value);
        }
        archive.template load<json::token::end_object>();
    }